

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::defaultListTests
               (ostream *out,ColourImpl *streamColour,
               vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
               bool isFiltered,Verbosity verbosity)

{
  pointer pTVar1;
  TestCaseInfo *pTVar2;
  long lVar3;
  ostream *poVar4;
  pointer pTVar5;
  char *pcVar6;
  TestCaseHandle *test;
  Code CVar7;
  ColourGuard colourGuard;
  Column local_90;
  enable_if_t<_::Catch::Detail::IsStreamInsertable<SourceLineInfo>::value,_std::string> local_50;
  
  if (verbosity != Quiet) {
    pcVar6 = "All available test cases:\n";
    if (isFiltered) {
      pcVar6 = "Matching test cases:\n";
    }
    std::operator<<(out,pcVar6);
    pTVar1 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar5 = (tests->
                  super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)
                  ._M_impl.super__Vector_impl_data._M_start; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1)
    {
      pTVar2 = pTVar5->m_info;
      CVar7 = None;
      if ((pTVar2->properties & IsHidden) != None) {
        CVar7 = FileName;
      }
      local_90.m_string.m_string._M_string_length._0_5_ = CONCAT14(1,CVar7);
      local_90.m_string.m_string._M_dataplus._M_p = (pointer)streamColour;
      (*streamColour->_vptr_ColourImpl[2])(streamColour,(ulong)CVar7);
      colourGuard.m_engaged = true;
      local_90.m_string.m_string._M_string_length._0_5_ =
           (uint5)(uint)local_90.m_string.m_string._M_string_length;
      colourGuard.m_colourImpl = streamColour;
      colourGuard.m_code = CVar7;
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_90);
      TextFlow::Column::Column(&local_90,&pTVar2->name);
      local_90.m_indent = 2;
      TextFlow::operator<<(out,&local_90);
      std::operator<<(out,'\n');
      std::__cxx11::string::~string((string *)&local_90);
      if (1 < (int)verbosity) {
        StringMaker<Catch::SourceLineInfo,_void>::convert<Catch::SourceLineInfo>
                  (&local_50,&pTVar2->lineInfo);
        TextFlow::Column::Column(&local_90,&local_50);
        local_90.m_indent = 4;
        TextFlow::operator<<(out,&local_90);
        std::operator<<(out,'\n');
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
      }
      if ((0 < (int)verbosity) &&
         ((pTVar2->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pTVar2->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        TestCaseInfo::tagsAsString_abi_cxx11_(&local_50,pTVar2);
        TextFlow::Column::Column(&local_90,&local_50);
        local_90.m_indent = 6;
        TextFlow::operator<<(out,&local_90);
        std::operator<<(out,'\n');
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
      }
      ColourImpl::ColourGuard::~ColourGuard(&colourGuard);
    }
    if (isFiltered) {
      lVar3 = (long)(tests->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(tests->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_90.m_string.m_string._M_string_length = 0x16cb3d;
      local_90.m_string.m_string.field_2._M_allocated_capacity = 0x12;
    }
    else {
      lVar3 = (long)(tests->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(tests->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_90.m_string.m_string._M_string_length = 0x16cb46;
      local_90.m_string.m_string.field_2._M_allocated_capacity = 9;
    }
    local_90.m_string.m_string._M_dataplus._M_p = (pointer)(lVar3 >> 4);
    operator<<(out,(pluralise *)&local_90);
    std::operator<<(out,"\n\n");
    std::ostream::flush();
    return;
  }
  pTVar1 = (tests->super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pTVar5 = (tests->
                super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
                _M_impl.super__Vector_impl_data._M_start; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1) {
    pTVar2 = pTVar5->m_info;
    if (((pTVar2->name)._M_string_length == 0) || (*(pTVar2->name)._M_dataplus._M_p != '#')) {
      std::operator<<(out,(string *)pTVar2);
    }
    else {
      poVar4 = std::operator<<(out,'\"');
      poVar4 = std::operator<<(poVar4,(string *)pTVar2);
      std::operator<<(poVar4,'\"');
    }
    std::operator<<(out,'\n');
  }
  std::ostream::flush();
  return;
}

Assistant:

void defaultListTests(std::ostream& out, ColourImpl* streamColour, std::vector<TestCaseHandle> const& tests, bool isFiltered, Verbosity verbosity) {
        // We special case this to provide the equivalent of old
        // `--list-test-names-only`, which could then be used by the
        // `--input-file` option.
        if (verbosity == Verbosity::Quiet) {
            listTestNamesOnly(out, tests);
            return;
        }

        if (isFiltered) {
            out << "Matching test cases:\n";
        } else {
            out << "All available test cases:\n";
        }

        for (auto const& test : tests) {
            auto const& testCaseInfo = test.getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            auto colourGuard = streamColour->guardColour( colour ).engage( out );

            out << TextFlow::Column(testCaseInfo.name).indent(2) << '\n';
            if (verbosity >= Verbosity::High) {
                out << TextFlow::Column(Catch::Detail::stringify(testCaseInfo.lineInfo)).indent(4) << '\n';
            }
            if (!testCaseInfo.tags.empty() &&
                verbosity > Verbosity::Quiet) {
                out << TextFlow::Column(testCaseInfo.tagsAsString()).indent(6) << '\n';
            }
        }

        if (isFiltered) {
            out << pluralise(tests.size(), "matching test case"_sr);
        } else {
            out << pluralise(tests.size(), "test case"_sr);
        }
        out << "\n\n" << std::flush;
    }